

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printOpenHeader(this,_name);
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000198310 = 0x2e2e2e2e2e2e2e;
    uRam0000000000198317._0_1_ = '.';
    uRam0000000000198317._1_1_ = '.';
    uRam0000000000198317._2_1_ = '.';
    uRam0000000000198317._3_1_ = '.';
    uRam0000000000198317._4_1_ = '.';
    uRam0000000000198317._5_1_ = '.';
    uRam0000000000198317._6_1_ = '.';
    uRam0000000000198317._7_1_ = '.';
    DAT_00198300 = '.';
    DAT_00198300_1._0_1_ = '.';
    DAT_00198300_1._1_1_ = '.';
    DAT_00198300_1._2_1_ = '.';
    DAT_00198300_1._3_1_ = '.';
    DAT_00198300_1._4_1_ = '.';
    DAT_00198300_1._5_1_ = '.';
    DAT_00198300_1._6_1_ = '.';
    uRam0000000000198308 = 0x2e2e2e2e2e2e2e;
    DAT_0019830f = 0x2e;
    DAT_001982f0 = '.';
    DAT_001982f0_1._0_1_ = '.';
    DAT_001982f0_1._1_1_ = '.';
    DAT_001982f0_1._2_1_ = '.';
    DAT_001982f0_1._3_1_ = '.';
    DAT_001982f0_1._4_1_ = '.';
    DAT_001982f0_1._5_1_ = '.';
    DAT_001982f0_1._6_1_ = '.';
    uRam00000000001982f8._0_1_ = '.';
    uRam00000000001982f8._1_1_ = '.';
    uRam00000000001982f8._2_1_ = '.';
    uRam00000000001982f8._3_1_ = '.';
    uRam00000000001982f8._4_1_ = '.';
    uRam00000000001982f8._5_1_ = '.';
    uRam00000000001982f8._6_1_ = '.';
    uRam00000000001982f8._7_1_ = '.';
    DAT_001982e0 = '.';
    DAT_001982e0_1._0_1_ = '.';
    DAT_001982e0_1._1_1_ = '.';
    DAT_001982e0_1._2_1_ = '.';
    DAT_001982e0_1._3_1_ = '.';
    DAT_001982e0_1._4_1_ = '.';
    DAT_001982e0_1._5_1_ = '.';
    DAT_001982e0_1._6_1_ = '.';
    uRam00000000001982e8._0_1_ = '.';
    uRam00000000001982e8._1_1_ = '.';
    uRam00000000001982e8._2_1_ = '.';
    uRam00000000001982e8._3_1_ = '.';
    uRam00000000001982e8._4_1_ = '.';
    uRam00000000001982e8._5_1_ = '.';
    uRam00000000001982e8._6_1_ = '.';
    uRam00000000001982e8._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001982d8._0_1_ = '.';
    uRam00000000001982d8._1_1_ = '.';
    uRam00000000001982d8._2_1_ = '.';
    uRam00000000001982d8._3_1_ = '.';
    uRam00000000001982d8._4_1_ = '.';
    uRam00000000001982d8._5_1_ = '.';
    uRam00000000001982d8._6_1_ = '.';
    uRam00000000001982d8._7_1_ = '.';
    DAT_0019831f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}